

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_switch_Dyy(response_layer *layer,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *pfVar7;
  float *pfVar8;
  bool *pbVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  long lVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  integral_image *in_stack_000000e8;
  response_layer *in_stack_000000f0;
  undefined8 uStack_170;
  float afStack_168 [2];
  uint local_160;
  int local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  long local_148;
  int local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  int local_128;
  int local_124;
  float local_120;
  float local_11c;
  float local_118;
  float local_114;
  int local_110;
  int local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  int local_f8;
  int local_f4;
  undefined8 in_stack_ffffffffffffff10;
  unsigned_long __vla_expr0;
  undefined4 in_stack_ffffffffffffff20;
  int iVar23;
  int iVar24;
  int local_d8;
  int y;
  int x;
  int k0;
  int k;
  int j;
  int i;
  int ind;
  bool *laplacian;
  float *response;
  int c01;
  int c00;
  int r01;
  int r00;
  int c11;
  int c10;
  int r11;
  int r10;
  float D1;
  float D0;
  float C1;
  float C0;
  float B1;
  float B0;
  float A1;
  float A0;
  float D;
  float C;
  float B;
  float A;
  float Dyy1;
  float Dyy0;
  float Dxy;
  float Dyy;
  float Dxx;
  float inv_area;
  int lobe;
  int border;
  int filter_size;
  int step;
  float *data;
  int iheight;
  int iwidth;
  int data_width;
  int width;
  int height;
  integral_image *iimage_local;
  response_layer *layer_local;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  
  iVar2 = layer->height;
  iVar3 = layer->width;
  iVar24 = iimage->data_width;
  uVar4 = iimage->width;
  iVar23 = iimage->height;
  pfVar7 = iimage->data;
  iVar5 = layer->step;
  iVar6 = layer->filter_size;
  iVar14 = iVar6 / 3;
  fVar15 = 1.0 / (float)(iVar6 * iVar6);
  pfVar8 = layer->response;
  pbVar9 = layer->laplacian;
  j = 0;
  if (iVar23 < iVar6) {
    if ((iVar6 + -1) / 2 < iVar23) {
      if (iVar14 * 2 + -1 < (int)uVar4) {
        uStack_170 = 0x1482d8;
        height_greater_border_width_greater_double_lobe_Dyy_inlined(layer,iimage);
      }
      else {
        uStack_170 = 0x1482e7;
        height_greater_border_width_less_double_lobe_Dyy_inlined(layer,iimage);
      }
    }
    else if (iVar14 < (int)uVar4) {
      __vla_expr0 = (unsigned_long)afStack_168;
      lVar13 = -((ulong)uVar4 * 4 + 0xf & 0xfffffffffffffff0);
      local_148 = (long)afStack_168 + lVar13;
      for (k = 0; k < iVar3 * iVar5 - iVar14; k = iVar5 + k) {
        *(float *)(local_148 + (long)k * 4) = pfVar7[(iVar23 + -1) * iVar24 + k + iVar14 + -1];
      }
      fVar1 = pfVar7[(int)((iVar23 + -1) * iVar24 + (uVar4 - 1))];
      for (; k < iVar14; k = iVar5 + k) {
        *(float *)(local_148 + (long)k * 4) = fVar1;
      }
      for (; k < iVar3 * iVar5; k = iVar5 + k) {
        *(float *)(local_148 + (long)k * 4) = fVar1 - pfVar7[(iVar23 + -1) * iVar24 + (k - iVar14)];
      }
      for (local_d8 = 0; local_d8 < iVar2 * iVar5; local_d8 = iVar5 + local_d8) {
        for (iVar24 = 0; iVar24 < iVar3 * iVar5; iVar24 = iVar5 + iVar24) {
          local_160 = *(uint *)(local_148 + (long)iVar24 * 4);
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148d9e;
          auVar21._0_4_ =
               box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                            *(int *)((long)&__vla_expr0 + lVar13 + 4),
                            *(int *)((long)&__vla_expr0 + lVar13),
                            *(int *)(&stack0xffffffffffffff14 + lVar13),
                            *(int *)(&stack0xffffffffffffff10 + lVar13));
          auVar21._4_60_ = extraout_var_02;
          auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar21._0_16_,ZEXT416(local_160)
                                   );
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148de6;
          local_158 = box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                                   *(int *)((long)&__vla_expr0 + lVar13 + 4),
                                   *(int *)((long)&__vla_expr0 + lVar13),
                                   *(int *)(&stack0xffffffffffffff14 + lVar13),
                                   *(int *)(&stack0xffffffffffffff10 + lVar13));
          local_15c = iVar24;
          iVar24 = local_15c;
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148e2e;
          auVar22._0_4_ =
               box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                            *(int *)((long)&__vla_expr0 + lVar13 + 4),
                            *(int *)((long)&__vla_expr0 + lVar13),
                            *(int *)(&stack0xffffffffffffff14 + lVar13),
                            *(int *)(&stack0xffffffffffffff10 + lVar13));
          auVar22._4_60_ = extraout_var_03;
          auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar22._0_16_,
                                    ZEXT416((uint)local_158));
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148e6e;
          local_154 = box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                                   *(int *)((long)&__vla_expr0 + lVar13 + 4),
                                   *(int *)((long)&__vla_expr0 + lVar13),
                                   *(int *)(&stack0xffffffffffffff14 + lVar13),
                                   *(int *)(&stack0xffffffffffffff10 + lVar13));
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148e98;
          local_150 = box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                                   *(int *)((long)&__vla_expr0 + lVar13 + 4),
                                   *(int *)((long)&__vla_expr0 + lVar13),
                                   *(int *)(&stack0xffffffffffffff14 + lVar13),
                                   *(int *)(&stack0xffffffffffffff10 + lVar13));
          local_150 = local_154 + local_150;
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148ed2;
          local_14c = box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                                   *(int *)((long)&__vla_expr0 + lVar13 + 4),
                                   *(int *)((long)&__vla_expr0 + lVar13),
                                   *(int *)(&stack0xffffffffffffff14 + lVar13),
                                   *(int *)(&stack0xffffffffffffff10 + lVar13));
          local_14c = local_150 - local_14c;
          *(undefined8 *)((long)afStack_168 + lVar13 + -8) = 0x148f0c;
          fVar17 = box_integral(*(integral_image **)(&stack0xffffffffffffff20 + lVar13),
                                *(int *)((long)&__vla_expr0 + lVar13 + 4),
                                *(int *)((long)&__vla_expr0 + lVar13),
                                *(int *)(&stack0xffffffffffffff14 + lVar13),
                                *(int *)(&stack0xffffffffffffff10 + lVar13));
          fVar1 = fVar15 * auVar11._0_4_;
          fVar10 = fVar15 * auVar12._0_4_;
          fVar17 = fVar15 * (local_14c - fVar17);
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar10),
                                    ZEXT416((uint)-(fVar17 * 0.81 * fVar17)));
          pfVar8[j] = auVar11._0_4_;
          pbVar9[j] = 0.0 <= fVar10 + fVar1;
          j = j + 1;
        }
      }
    }
    else {
      fVar1 = pfVar7[(int)((iVar23 + -1) * iVar24 + (uVar4 - 1))];
      for (local_d8 = 0; local_f4 = local_d8, local_d8 < iVar3 * iVar5 - iVar14 / 2;
          local_d8 = iVar5 + local_d8) {
        local_f8 = local_d8;
        auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),
                                  ZEXT416((uint)pfVar7[(int)(((local_d8 - iVar14 / 2) + -1 + iVar14)
                                                             * iVar24 + (uVar4 - 1))]),
                                  ZEXT416((uint)fVar1));
        fVar10 = fVar15 * auVar11._0_4_;
        for (iVar23 = 0; iVar23 < iVar3 * iVar5; iVar23 = iVar5 + iVar23) {
          uStack_170 = 0x148431;
          local_108 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_10c = iVar23;
          uStack_170 = 0x148479;
          iVar23 = local_10c;
          auVar18._0_4_ =
               box_integral((integral_image *)CONCAT44(local_10c,in_stack_ffffffffffffff20),
                            __vla_expr0._4_4_,(int)__vla_expr0,
                            (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (int)in_stack_ffffffffffffff10);
          auVar18._4_60_ = extraout_var;
          auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar18._0_16_,
                                    ZEXT416((uint)local_108));
          uStack_170 = 0x1484b9;
          local_104 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          uStack_170 = 0x1484e3;
          local_100 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_100 = local_104 + local_100;
          uStack_170 = 0x14851d;
          local_fc = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                  __vla_expr0._4_4_,(int)__vla_expr0,
                                  (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                  (int)in_stack_ffffffffffffff10);
          local_fc = local_100 - local_fc;
          uStack_170 = 0x148557;
          fVar16 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                __vla_expr0._4_4_,(int)__vla_expr0,
                                (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                (int)in_stack_ffffffffffffff10);
          fVar17 = fVar15 * auVar11._0_4_;
          fVar16 = fVar15 * (local_fc - fVar16);
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar17),
                                    ZEXT416((uint)-(fVar16 * 0.81 * fVar16)));
          pfVar8[j] = auVar11._0_4_;
          pbVar9[j] = 0.0 <= fVar17 + fVar10;
          j = j + 1;
        }
      }
      fVar10 = fVar15 * fVar1 * -2.0;
      for (; local_110 = local_d8, local_d8 < iVar14 / 2 + 1; local_d8 = iVar5 + local_d8) {
        for (iVar23 = 0; iVar23 < iVar3 * iVar5; iVar23 = iVar5 + iVar23) {
          uStack_170 = 0x1486c4;
          local_120 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_124 = iVar23;
          uStack_170 = 0x14870c;
          iVar23 = local_124;
          auVar19._0_4_ =
               box_integral((integral_image *)CONCAT44(local_124,in_stack_ffffffffffffff20),
                            __vla_expr0._4_4_,(int)__vla_expr0,
                            (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (int)in_stack_ffffffffffffff10);
          auVar19._4_60_ = extraout_var_00;
          auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar19._0_16_,
                                    ZEXT416((uint)local_120));
          uStack_170 = 0x14874c;
          local_11c = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          uStack_170 = 0x148776;
          local_118 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_118 = local_11c + local_118;
          uStack_170 = 0x1487b0;
          local_114 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_114 = local_118 - local_114;
          uStack_170 = 0x1487ea;
          fVar16 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                __vla_expr0._4_4_,(int)__vla_expr0,
                                (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                (int)in_stack_ffffffffffffff10);
          fVar17 = fVar15 * auVar11._0_4_;
          fVar16 = fVar15 * (local_114 - fVar16);
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar17),
                                    ZEXT416((uint)-(fVar16 * 0.81 * fVar16)));
          pfVar8[j] = auVar11._0_4_;
          pbVar9[j] = 0.0 <= fVar17 + fVar10;
          j = j + 1;
        }
      }
      for (; local_d8 < iVar2 * iVar5; local_d8 = iVar5 + local_d8) {
        local_128 = local_d8;
        auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),
                                  ZEXT416((uint)pfVar7[(int)(((local_d8 - iVar14 / 2) + -1) * iVar24
                                                            + (uVar4 - 1))]),
                                  ZEXT416((uint)-(fVar1 * 2.0)));
        fVar10 = fVar15 * auVar11._0_4_;
        for (iVar23 = 0; iVar23 < iVar3 * iVar5; iVar23 = iVar5 + iVar23) {
          uStack_170 = 0x1489b0;
          local_138 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_13c = iVar23;
          uStack_170 = 0x1489f8;
          iVar23 = local_13c;
          auVar20._0_4_ =
               box_integral((integral_image *)CONCAT44(local_13c,in_stack_ffffffffffffff20),
                            __vla_expr0._4_4_,(int)__vla_expr0,
                            (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                            (int)in_stack_ffffffffffffff10);
          auVar20._4_60_ = extraout_var_01;
          auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar20._0_16_,
                                    ZEXT416((uint)local_138));
          uStack_170 = 0x148a38;
          local_134 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          uStack_170 = 0x148a62;
          local_130 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_130 = local_134 + local_130;
          uStack_170 = 0x148a9c;
          local_12c = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                   __vla_expr0._4_4_,(int)__vla_expr0,
                                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                   (int)in_stack_ffffffffffffff10);
          local_12c = local_130 - local_12c;
          uStack_170 = 0x148ad6;
          fVar16 = box_integral((integral_image *)CONCAT44(iVar23,in_stack_ffffffffffffff20),
                                __vla_expr0._4_4_,(int)__vla_expr0,
                                (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                                (int)in_stack_ffffffffffffff10);
          fVar17 = fVar15 * auVar11._0_4_;
          fVar16 = fVar15 * (local_12c - fVar16);
          auVar11 = vfmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar17),
                                    ZEXT416((uint)-(fVar16 * 0.81 * fVar16)));
          pfVar8[j] = auVar11._0_4_;
          pbVar9[j] = 0.0 <= fVar17 + fVar10;
          j = j + 1;
        }
      }
    }
  }
  else {
    uStack_170 = 0x1482af;
    compute_response_layer_Dyy_laplacian_locality_inlined(in_stack_000000f0,in_stack_000000e8);
  }
  return;
}

Assistant:

void compute_response_layer_switch_Dyy(struct response_layer *layer, struct integral_image *iimage) {
    /*
        optimizations:
            - Case distinction to calculate Dyy filter more optimaly
            - Combination of different functions and uses them depending on case
    */

    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int i, j, k, k0;
    int x = 0;
    int y = 0;

    // 1. Case The filter is smaller than the image
    if (filter_size <= iheight) {
        // Split the image into 9 cases - corners, borders and middle part.
        compute_response_layer_Dyy_laplacian_locality_inlined(layer, iimage);

    } else {
        // 2. Case The filter is taller than the image
        if (iheight > border) {

            // 2.1. D is sometimes outside the image.
            // everytime all corners are outside, we just use row values above
            if (iwidth > 2 * lobe - 1) {
                height_greater_border_width_greater_double_lobe_Dyy_inlined(layer, iimage);
            } else {
                height_greater_border_width_less_double_lobe_Dyy_inlined(layer, iimage);
            }

        } else {
            // Case 2.2 D is always outside the image.
            // Half the filter height is longer than the image.  // TODO this makes no sense
            if (iwidth <= lobe) {
                // Case 2.2a the filter is longer and wider than the image.

                // D is right bottom corner or to the right (possibly below image)
                // A, B, C = 0
                D0 = data[(iheight-1) * data_width + (iwidth-1)];

                // Differentiate 2 cases
                // for the negative part:
                // 1.
                // is negative / inner part of Dyy box filter completely too big
                // i.e. is inner D on the right bottom corner or even bigger (to the right or below)
                // SADLY THIS CASE NEVER HAPPENS. CRY :(

                // if (iheight <= lobe/2-1) {
                // D1 = D0;
                //
                // // combine Dyy
                // Dyy = D0 - 3 * D1;
                // Dyy *= inv_area;
                //
                // for (i = 0; i < height * step; i += step) {
                //
                //     for (j = 0; j < width * step; j += step) {
                //         // Image coordinates
                //         x = i;
                //         y = j;
                //
                //         // Calculate Dxx, Dyy, Dxy with Box Filter
                //         Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                //                 - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                //         Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                //                 + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                //                 - box_integral(iimage, x + 1, y + 1, lobe, lobe);
                //
                //         // Normalize Responses with inverse area
                //         Dyy *= inv_area;
                //         Dxy *= inv_area;
                //
                //         // Calculate Determinant
                //         response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;
                //
                //         // Calculate Laplacian
                //         laplacian[ind] = Dxx + Dyy >= 0;
                //         ind += 1;
                //     }
                // }

                // 2. Case
                // Only for - image_size: 32, filter_size: 99
                // inner D is in last col but the inner part is not too big
                // col is irrelevant, B and D have always the same value
                // i.e. inner loop is irrelevant for coords and values

                // We divide it again in 3 parts.
                // 1. B outside, D inside
                // 2. B outside, D outside
                // 3. B inside, D outside

                // 1. Case: B outside, D inside
                for (x = 0; x < width*step-lobe/2; x += step) {
                    // negative part
                    r10 = x - lobe / 2 - 1;
                    r11 = r10 + lobe;  // TODO fixer

                    D1 = data[r11 * data_width + (iwidth-1)];

                    // Compute Dyy
                    Dyy = D0 - 3 * D1;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 2. Case: B outside, D outside
                Dyy = - 2 * D0;
                Dyy *= inv_area;

                for (; x < lobe/2+1; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

                // 3. Case: B inside, D outside
                for (; x < height * step; x += step) {

                    r10 = x - lobe / 2 - 1;

                    B = data[r10 * data_width + (iwidth-1)];
                    // D1 = D0 - B;
                    // Dyy = D0 - 3 * D1;
                    // Dyy *= inv_area;

                    // this can be simplified to:
                    // (small difference in original is this but error is <0.000001 eps)
                    Dyy = 3*B - 2*D0;
                    Dyy *= inv_area;

                    for (y = 0; y < width * step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;
                        ind += 1;
                    }
                }

            } else {
                /* 2.2.b Half the filter is longer than the image, but narrower.
                // HERE: width > lobe and height <= border
                // Here only the whole filter is optimized, not negative part

                // Only happens for filter: 75 and image: 32

                // A, B = 0
                // D is outside (i.e. below) the image, but the columns change.
                // => D = [height-1, some_column]
                // C = 0 or [height-1, some_column]
                */

                // Create array for Dyy that has image width length
                // all rows (for big part) have same Dyy values
                float Dyy_arr[iwidth];  // stack is faster than heap

                // C = 0 and D = [height-1, some_column]
                // from y = 0 until D is (exclusive) in last column
                for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
                    // C = 0
                    // D = [height-1, i+lobe-1]
                    D = data[(iheight-1) * data_width + (i+lobe-1)];
                    Dyy_arr[i] = D;
                }

                // only bottom left corner value needed
                D = data[(iheight-1) * data_width + (iwidth-1)];

                // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
                // C is still outside and D now too
                for (; i < lobe; i += step) {  // 7 - 25
                    Dyy_arr[i] = D;
                }

                // if y = lobe, then C = [height-1, 0]
                // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
                for (; i < width*step; i += step) {  // 25 - 32
                    // C = [height-1, i-lobe]
                    // D = [height-1, width-1]
                    C = data[(iheight-1) * data_width + (i-lobe)];
                    Dyy_arr[i] = D - C;
                }

                // Use precomputation for faster compute
                for (x = 0; x < height*step; x += step) {

                    for (y = 0; y < width*step; y += step) {

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        Dyy = Dyy_arr[y] - 3 * box_integral(iimage, x - lobe / 2, y - lobe + 1, lobe, 2 * lobe - 1);
                        Dxx = box_integral(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        Dxy = box_integral(iimage, x - lobe, y + 1, lobe, lobe)
                                + box_integral(iimage, x + 1, y - lobe, lobe, lobe)
                                - box_integral(iimage, x - lobe, y - lobe, lobe, lobe)
                                - box_integral(iimage, x + 1, y + 1, lobe, lobe);

                        // Normalize Responses with inverse area
                        Dyy *= inv_area;
                        Dxx *= inv_area;
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

                        // Calculate Laplacian
                        laplacian[ind] = Dxx + Dyy >= 0;

                        // Increment index
                        ind += 1;
                    }
                }
            }
        }
    }
}